

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeFabricEdgeGetVerticesExp
          (ze_fabric_edge_handle_t hEdge,ze_fabric_vertex_handle_t *phVertexA,
          ze_fabric_vertex_handle_t *phVertexB)

{
  ze_fabric_vertex_handle_t p_Var1;
  ze_pfnFabricEdgeGetVerticesExp_t pfnGetVerticesExp;
  ze_result_t result;
  ze_fabric_vertex_handle_t *phVertexB_local;
  ze_fabric_vertex_handle_t *phVertexA_local;
  ze_fabric_edge_handle_t hEdge_local;
  
  pfnGetVerticesExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c780 == (code *)0x0) {
    p_Var1 = (ze_fabric_vertex_handle_t)context_t::get((context_t *)&context);
    *phVertexA = p_Var1;
    p_Var1 = (ze_fabric_vertex_handle_t)context_t::get((context_t *)&context);
    *phVertexB = p_Var1;
  }
  else {
    pfnGetVerticesExp._4_4_ = (*DAT_0011c780)(hEdge,phVertexA,phVertexB);
  }
  return pfnGetVerticesExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetVerticesExp(
        ze_fabric_edge_handle_t hEdge,                  ///< [in] handle of the fabric edge instance
        ze_fabric_vertex_handle_t* phVertexA,           ///< [out] fabric vertex connected to one end of the given fabric edge.
        ze_fabric_vertex_handle_t* phVertexB            ///< [out] fabric vertex connected to other end of the given fabric edge.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetVerticesExp = context.zeDdiTable.FabricEdgeExp.pfnGetVerticesExp;
        if( nullptr != pfnGetVerticesExp )
        {
            result = pfnGetVerticesExp( hEdge, phVertexA, phVertexB );
        }
        else
        {
            // generic implementation
            *phVertexA = reinterpret_cast<ze_fabric_vertex_handle_t>( context.get() );

            *phVertexB = reinterpret_cast<ze_fabric_vertex_handle_t>( context.get() );

        }

        return result;
    }